

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O0

undefined8 __thiscall rcg::Buffer::getTLType_abi_cxx11_(Buffer *this)

{
  undefined8 *in_RSI;
  undefined8 in_RDI;
  BUFFER_INFO_CMD in_stack_00000404;
  void *in_stack_00000408;
  void *in_stack_00000410;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_00000418;
  
  Stream::getHandle((Stream *)*in_RSI);
  (anonymous_namespace)::getBufferString_abi_cxx11_
            (in_stack_00000418,in_stack_00000410,in_stack_00000408,in_stack_00000404);
  return in_RDI;
}

Assistant:

std::string Buffer::getTLType() const
{
  return getBufferString(gentl, parent->getHandle(), buffer, GenTL::BUFFER_INFO_TLTYPE);
}